

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef CompileLlvmWhile(LlvmCompilationContext *ctx,ExprWhile *node)

{
  TypeBase *type;
  LoopInfo local_28;
  
  local_28.breakBlock = (LLVMBasicBlockRef)&placeholderBasicBlock;
  local_28.continueBlock = (LLVMBasicBlockRef)&placeholderBasicBlock;
  SmallArray<LlvmCompilationContext::LoopInfo,_32U>::push_back(&ctx->loopInfo,&local_28);
  CompileLlvm(ctx,node->condition);
  type = GetStackType(ctx,node->condition->type);
  CompileLlvmType(ctx,type);
  CompileLlvm(ctx,node->body);
  SmallArray<LlvmCompilationContext::LoopInfo,_32U>::pop_back(&ctx->loopInfo);
  CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)0x0);
  return (LLVMValueRef)0x0;
}

Assistant:

LLVMValueRef CompileLlvmWhile(LlvmCompilationContext &ctx, ExprWhile *node)
{
	LLVMBasicBlockRef conditionBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "while_cond");
	LLVMBasicBlockRef bodyBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "while_body");
	LLVMBasicBlockRef exitBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "while_exit");

	ctx.loopInfo.push_back(LlvmCompilationContext::LoopInfo(exitBlock, conditionBlock));

	LLVMBuildBr(ctx.builder, conditionBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, conditionBlock);

	LLVMValueRef condition = CompileLlvm(ctx, node->condition);

	condition = LLVMBuildICmp(ctx.builder, LLVMIntNE, condition, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->condition->type)), 0, true), "");

	LLVMBuildCondBr(ctx.builder, condition, bodyBlock, exitBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, bodyBlock);

	CompileLlvm(ctx, node->body);

	LLVMBuildBr(ctx.builder, conditionBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, exitBlock);

	ctx.loopInfo.pop_back();

	return CheckType(ctx, node, NULL);
}